

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# filesystem.c++
# Opt level: O2

char * __thiscall kj::PathPtr::basename(PathPtr *this,char *__filename)

{
  Fault f;
  DebugComparison<unsigned_long,_int> _kjCondition;
  
  _kjCondition.left = (this->parts).size_;
  _kjCondition.right = 0;
  _kjCondition.op.content.ptr = " > ";
  _kjCondition.op.content.size_ = 4;
  _kjCondition.result = _kjCondition.left != 0;
  if (_kjCondition.result) {
    return (char *)((this->parts).ptr + (_kjCondition.left - 1));
  }
  _::Debug::Fault::
  Fault<kj::Exception::Type,kj::_::DebugComparison<unsigned_long,int>&,char_const(&)[26]>
            (&f,
             "/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/filesystem.c++"
             ,0x74,FAILED,"parts.size() > 0","_kjCondition,\"root path has no basename\"",
             &_kjCondition,(char (*) [26])"root path has no basename");
  _::Debug::Fault::fatal(&f);
}

Assistant:

kj::Own<const File> create(const Clock& clock) const override {
      return newMemfdFile(0);
    }